

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O0

numeric * cs::parse_number(string *str)

{
  long lVar1;
  char in_SIL;
  numeric *in_RDI;
  exception *e;
  size_t *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  longlong local_40 [3];
  longdouble local_28 [2];
  
  lVar1 = std::__cxx11::string::find(in_SIL,0x2e);
  if (lVar1 == -1) {
    local_40[0] = std::__cxx11::stoll(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0);
    numeric::numeric<long_long>(in_RDI,local_40);
  }
  else {
    std::__cxx11::stold(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    numeric::numeric<long_double>(in_RDI,local_28);
  }
  return in_RDI;
}

Assistant:

numeric parse_number(const std::string &str)
	{
		try {
			if (str.find('.') != std::string::npos)
				return std::stold(str);
			else
				return std::stoll(str);
		}
		catch (const std::exception &e) {
			throw lang_error("Wrong literal format.");
		}
	}